

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_Web.cpp
# Opt level: O2

string * generate_no_db_page_abi_cxx11_(query_table_type *query_params)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string local_38;
  
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  std::__cxx11::string::string((string *)this,&pluginInstance.header);
  if (RenX::ladder_databases[1] == *RenX::ladder_databases) {
    local_38._M_dataplus._M_p = (pointer)0x21;
    local_38._M_string_length = 0x112804;
  }
  else {
    generate_search_abi_cxx11_(&local_38,(LadderDatabase *)0x0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    generate_database_selector_abi_cxx11_(&local_38,(LadderDatabase *)0x0,query_params);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    local_38._M_dataplus._M_p = (pointer)0x1e;
    local_38._M_string_length = 0x1127e5;
  }
  std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)this,(basic_string_view<char,_std::char_traits<char>_> *)&local_38);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (this,&pluginInstance.footer);
  return this;
}

Assistant:

std::string* generate_no_db_page(const query_table_type& query_params) {
	std::string* result = new std::string(pluginInstance.header);
	if (RenX::ladder_databases.size() != 0) {
		result->append(generate_search(nullptr));
		result->append(generate_database_selector(nullptr, query_params));
		result->append("Error: No such database exists"sv);
	}
	else {
		result->append("Error: No ladder databases loaded"sv);
	}
	result->append(pluginInstance.footer);
	return result;
}